

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

Vector<int,_3,_true> __thiscall
Nova::Vector<int,_4,_true>::Remove_Index(Vector<int,_4,_true> *this,int index)

{
  ulong uVar1;
  uint in_EDX;
  uint extraout_EDX;
  undefined4 in_register_00000034;
  bool bVar2;
  Vector<int,_3,_true> VVar3;
  
  if (in_EDX < 4) {
    uVar1 = (ulong)in_EDX;
    (this->_data)._M_elems[2] = 0;
    (this->_data)._M_elems[0] = 0;
    (this->_data)._M_elems[1] = 0;
    if ((in_EDX == 0) ||
       (memcpy(this,(void *)CONCAT44(in_register_00000034,index),(ulong)(in_EDX * 4)),
       bVar2 = in_EDX != 3, in_EDX = extraout_EDX, bVar2)) {
      do {
        (this->_data)._M_elems[uVar1] =
             *(int *)((long)CONCAT44(in_register_00000034,index) + uVar1 * 4 + 4);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 3);
    }
    VVar3._data._M_elems[2] = in_EDX;
    VVar3._data._M_elems._0_8_ = this;
    return (Vector<int,_3,_true>)VVar3._data._M_elems;
  }
  __assert_fail("index>=0 && index<d",
                "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Geometry/../Tools/include/nova/Tools/Vectors/Vector.h"
                ,0x1d2,
                "Vector<T, d - 1> Nova::Vector<int, 4>::Remove_Index(const int) const [T = int, d = 4, order_ascending = true]"
               );
}

Assistant:

Vector<T,d-1> Remove_Index(const int index) const
    {
        assert(index>=0 && index<d);
        Vector<T,d-1> ret;
        for(int i=0;i<index;++i) ret[i]=(*this)[i];
        for(int i=index+1;i<d;++i) ret[i-1]=(*this)[i];
        return ret;
    }